

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O1

void __thiscall Sector::remove_gapdata(Sector *this,bool keep_crc)

{
  int iVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  
  bVar3 = has_gapdata(this);
  if (bVar3) {
    pvVar2 = &((this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
               super__Vector_impl_data._M_finish)->
              super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    for (this_00 = &((this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                     super__Vector_impl_data._M_start)->
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>; this_00 != pvVar2;
        this_00 = this_00 + 1) {
      if ((keep_crc) && (this->m_bad_data_crc == true)) {
        iVar5 = *(int *)&(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
        iVar1 = *(int *)&(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         )._M_impl.super__Vector_impl_data._M_start;
        iVar4 = Header::sector_size(&this->header);
        if (iVar5 - iVar1 < iVar4 + 2) goto LAB_0016c53e;
        iVar5 = Header::sector_size(&this->header);
        iVar5 = iVar5 + 2;
      }
      else {
LAB_0016c53e:
        iVar5 = Header::sector_size(&this->header);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,(long)iVar5);
    }
  }
  return;
}

Assistant:

void Sector::remove_gapdata(bool keep_crc/*=false*/)
{
    if (!has_gapdata())
        return;

    for (auto& data : m_data)
    {
        // If requested, attempt to preserve CRC bytes on bad sectors.
        if (keep_crc && has_baddatacrc() && data.size() >= (size() + 2))
            data.resize(size() + 2);
        else
            data.resize(size());
    }
}